

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<DefaultFormatter>::Unser<DataStream,std::vector<CTxIn,std::allocator<CTxIn>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<CTxIn,_std::allocator<CTxIn>_> *v)

{
  long lVar1;
  uint64_t uVar2;
  ulong __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear(v);
  uVar2 = ReadCompactSize<DataStream>(s,true);
  __n = 0;
  while (__n < uVar2) {
    __n = __n + 0xbbcc;
    if (uVar2 <= __n) {
      __n = uVar2;
    }
    std::vector<CTxIn,_std::allocator<CTxIn>_>::reserve(v,__n);
    while ((ulong)(((long)(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                         super__Vector_impl_data._M_start) / 0x68) < __n) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<>(v);
      CTxIn::SerializationOps<DataStream,CTxIn,ActionUnserialize>
                ((v->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1,s);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }